

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkUpgradeToStruct
          (CompatibilityChecker *this,Reader *type,uint64_t structTypeId,
          Maybe<capnp::schema::Node::Reader> *matchSize,
          Maybe<capnp::schema::Field::Reader> *matchPosition)

{
  ushort uVar1;
  uint uVar2;
  void *pvVar3;
  Impl *this_00;
  undefined2 uVar4;
  undefined4 uVar5;
  undefined2 uVar6;
  Maybe<capnp::schema::Field::Reader> *params_2;
  ArrayPtr<capnp::word> firstSegment;
  Reader value_00;
  Reader value_01;
  Builder value;
  Reader matchSlot;
  Builder slot;
  Builder field;
  Builder structNode;
  Builder node;
  Reader local_278;
  PointerBuilder local_248;
  MallocMessageBuilder builder;
  word scratch [32];
  
  params_2 = matchPosition;
  memset(scratch,0,0x100);
  firstSegment.size_ = 0x20;
  firstSegment.ptr = scratch;
  MallocMessageBuilder::MallocMessageBuilder(&builder,firstSegment,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnp::schema::Node>(&node,&builder.super_MessageBuilder);
  *(uint64_t *)node._builder.data = structTypeId;
  kj::str<char_const(&)[23],capnp::Text::Reader&,char_const(&)[2]>
            ((String *)&value,(kj *)"(unknown type used in ",(char (*) [23])&this->nodeName,
             (Reader *)0x1a9b4b,(char (*) [2])params_2);
  if (value._builder.capTable == (CapTableBuilder *)0x0) {
    value._builder.segment = (SegmentBuilder *)0x1ae02f;
  }
  value_00.super_StringPtr.content.size_ =
       (long)&((value._builder.capTable)->super_CapTableReader)._vptr_CapTableReader +
       (ulong)(value._builder.capTable == (CapTableBuilder *)0x0);
  value_00.super_StringPtr.content.ptr = (char *)value._builder.segment;
  capnp::schema::Node::Builder::setDisplayName(&node,value_00);
  kj::Array<char>::~Array((Array<char> *)&value);
  capnp::schema::Node::Builder::initStruct(&structNode,&node);
  if ((type->_reader).dataSize < 0x10) {
    uVar4 = 0;
    uVar6 = 0;
LAB_001768ba:
    *(undefined2 *)((long)structNode._builder.data + 0xe) = uVar4;
    *(undefined2 *)((long)structNode._builder.data + 0x18) = uVar6;
  }
  else {
    uVar1 = *(type->_reader).data;
    if (uVar1 < 0x13) {
      uVar2 = (uint)uVar1 * 2;
      uVar4 = *(undefined2 *)(&DAT_001a8552 + uVar2);
      uVar6 = *(undefined2 *)(&DAT_001a8578 + uVar2);
      goto LAB_001768ba;
    }
  }
  if ((matchSize->ptr).isSet == true) {
    uVar2 = *(uint *)((long)&(matchSize->ptr).field_1 + 0x20);
    if (uVar2 < 0x80) {
      *(undefined2 *)((long)structNode._builder.data + 0xe) = 0;
LAB_00176907:
      uVar4 = 0;
    }
    else {
      pvVar3 = (matchSize->ptr).field_1.value._reader.data;
      *(undefined2 *)((long)structNode._builder.data + 0xe) = *(undefined2 *)((long)pvVar3 + 0xe);
      if (uVar2 < 0xd0) goto LAB_00176907;
      uVar4 = *(undefined2 *)((long)pvVar3 + 0x18);
    }
    *(undefined2 *)((long)structNode._builder.data + 0x18) = uVar4;
  }
  capnp::schema::Node::Struct::Builder::initFields((Builder *)&value,&structNode,1);
  _::ListBuilder::getStructElement(&field._builder,(ListBuilder *)&value,0);
  value_01.super_StringPtr.content.size_ = 8;
  value_01.super_StringPtr.content.ptr = "member0";
  capnp::schema::Field::Builder::setName(&field,value_01);
  *(undefined2 *)field._builder.data = 0;
  capnp::schema::Field::Builder::initSlot(&slot,&field);
  value._builder.segment = (SegmentBuilder *)(type->_reader).segment;
  value._builder.capTable = (CapTableBuilder *)(type->_reader).capTable;
  value._builder.data = (type->_reader).data;
  value._builder.pointers = (type->_reader).pointers;
  value._builder.dataSize = (type->_reader).dataSize;
  value._builder.pointerCount = (type->_reader).pointerCount;
  value._builder._38_2_ = *(undefined2 *)&(type->_reader).field_0x26;
  matchSlot._reader.data = slot._builder.pointers + 2;
  matchSlot._reader.segment = &(slot._builder.segment)->super_SegmentReader;
  matchSlot._reader.capTable = &(slot._builder.capTable)->super_CapTableReader;
  _::PointerBuilder::setStruct((PointerBuilder *)&matchSlot,(StructReader *)&value,false);
  if ((matchPosition->ptr).isSet == true) {
    uVar2 = *(uint *)((long)&(matchPosition->ptr).field_1 + 0x20);
    if ((uVar2 < 0x60) ||
       (pvVar3 = (matchPosition->ptr).field_1.value._reader.data, *(short *)((long)pvVar3 + 10) != 1
       )) {
      *(undefined2 *)((long)field._builder.data + 10) = 0;
    }
    else {
      if (uVar2 < 0x70) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(undefined2 *)((long)pvVar3 + 0xc);
      }
      *(undefined2 *)((long)field._builder.data + 10) = 1;
      *(undefined2 *)((long)field._builder.data + 0xc) = uVar4;
    }
    matchSlot._reader.segment = (matchPosition->ptr).field_1.value._reader.segment;
    matchSlot._reader.capTable = (matchPosition->ptr).field_1.value._reader.capTable;
    matchSlot._reader.data = (matchPosition->ptr).field_1.value._reader.data;
    matchSlot._reader.pointers = (matchPosition->ptr).field_1.value._reader.pointers;
    matchSlot._reader._32_8_ = *(undefined8 *)((long)&(matchPosition->ptr).field_1 + 0x20);
    matchSlot._reader.nestingLimit = *(int *)((long)&(matchPosition->ptr).field_1 + 0x28);
    matchSlot._reader._44_4_ = *(undefined4 *)((long)&(matchPosition->ptr).field_1 + 0x2c);
    uVar5 = 0;
    if (0x3f < matchSlot._reader.dataSize) {
      uVar5 = *(undefined4 *)((long)matchSlot._reader.data + 4);
    }
    *(undefined4 *)((long)slot._builder.data + 4) = uVar5;
    capnp::schema::Field::Slot::Reader::getDefaultValue(&local_278,&matchSlot);
    value._builder.dataSize = local_278._reader.dataSize;
    value._builder.pointerCount = local_278._reader.pointerCount;
    value._builder._38_2_ = local_278._reader._38_2_;
    value._builder.data = local_278._reader.data;
    value._builder.pointers = local_278._reader.pointers;
    value._builder.segment = (SegmentBuilder *)local_278._reader.segment;
    value._builder.capTable = (CapTableBuilder *)local_278._reader.capTable;
    local_248.pointer = slot._builder.pointers + 3;
    local_248.segment = slot._builder.segment;
    local_248.capTable = slot._builder.capTable;
    _::PointerBuilder::setStruct(&local_248,(StructReader *)&value,false);
    goto switchD_00176a49_default;
  }
  *(undefined4 *)((long)field._builder.data + 10) = 1;
  *(undefined4 *)((long)slot._builder.data + 4) = 0;
  capnp::schema::Field::Slot::Builder::initDefaultValue(&value,&slot);
  if ((type->_reader).dataSize < 0x10) {
switchD_00176a49_caseD_0:
    *(undefined2 *)value._builder.data = 0;
    goto switchD_00176a49_default;
  }
  switch(*(type->_reader).data) {
  case 0:
    goto switchD_00176a49_caseD_0;
  case 1:
    *(undefined2 *)value._builder.data = 1;
    *(byte *)((long)value._builder.data + 2) = *(byte *)((long)value._builder.data + 2) & 0xfe;
    break;
  case 2:
    *(undefined2 *)value._builder.data = 2;
    goto LAB_00176c41;
  case 3:
    *(undefined4 *)value._builder.data = 3;
    break;
  case 4:
    *(undefined2 *)value._builder.data = 4;
    goto LAB_00176c72;
  case 5:
    *(undefined2 *)value._builder.data = 5;
    goto LAB_00176c07;
  case 6:
    *(undefined2 *)value._builder.data = 6;
LAB_00176c41:
    *(undefined1 *)((long)value._builder.data + 2) = 0;
    break;
  case 7:
    *(undefined4 *)value._builder.data = 7;
    break;
  case 8:
    *(undefined2 *)value._builder.data = 8;
    goto LAB_00176c72;
  case 9:
    *(undefined2 *)value._builder.data = 9;
    goto LAB_00176c07;
  case 10:
    *(undefined2 *)value._builder.data = 10;
LAB_00176c72:
    *(undefined4 *)((long)value._builder.data + 4) = 0;
    break;
  case 0xb:
    *(undefined2 *)value._builder.data = 0xb;
LAB_00176c07:
    *(undefined8 *)((long)value._builder.data + 8) = 0;
    break;
  case 0xc:
    matchSlot._reader.data = (void *)0x0;
    matchSlot._reader.pointers = (WirePointer *)0x0;
    matchSlot._reader.segment = (SegmentReader *)0x0;
    matchSlot._reader.capTable = (CapTableReader *)0x0;
    capnp::schema::Value::Builder::adoptText(&value,(Orphan<capnp::Text> *)&matchSlot);
    _::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&matchSlot);
    break;
  case 0xd:
    matchSlot._reader.data = (void *)0x0;
    matchSlot._reader.pointers = (WirePointer *)0x0;
    matchSlot._reader.segment = (SegmentReader *)0x0;
    matchSlot._reader.capTable = (CapTableReader *)0x0;
    capnp::schema::Value::Builder::adoptData(&value,(Orphan<capnp::Data> *)&matchSlot);
    _::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&matchSlot);
    break;
  case 0xe:
    capnp::schema::Value::Builder::initList((Builder *)&matchSlot,&value);
    break;
  case 0xf:
    *(undefined4 *)value._builder.data = 0xf;
    break;
  case 0x10:
    capnp::schema::Value::Builder::initStruct((Builder *)&matchSlot,&value);
    break;
  case 0x11:
    *(undefined2 *)value._builder.data = 0x11;
    break;
  case 0x12:
    capnp::schema::Value::Builder::initAnyPointer((Builder *)&matchSlot,&value);
  }
switchD_00176a49_default:
  this_00 = this->loader;
  _::StructBuilder::asReader(&node._builder);
  Impl::load(this_00,(Reader *)&value,true);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

void checkUpgradeToStruct(const schema::Type::Reader& type, uint64_t structTypeId,
                            kj::Maybe<schema::Node::Reader> matchSize = nullptr,
                            kj::Maybe<schema::Field::Reader> matchPosition = nullptr) {
    // We can't just look up the target struct and check it because it may not have been loaded
    // yet.  Instead, we contrive a struct that looks like what we want and load() that, which
    // guarantees that any incompatibility will be caught either now or when the real version of
    // that struct is loaded.

    word scratch[32];
    memset(scratch, 0, sizeof(scratch));
    MallocMessageBuilder builder(scratch);
    auto node = builder.initRoot<schema::Node>();
    node.setId(structTypeId);
    node.setDisplayName(kj::str("(unknown type used in ", nodeName, ")"));
    auto structNode = node.initStruct();

    switch (type.which()) {
      case schema::Type::VOID:
        structNode.setDataWordCount(0);
        structNode.setPointerCount(0);
        break;

      case schema::Type::BOOL:
        structNode.setDataWordCount(1);
        structNode.setPointerCount(0);
        break;

      case schema::Type::INT8:
      case schema::Type::UINT8:
        structNode.setDataWordCount(1);
        structNode.setPointerCount(0);
        break;

      case schema::Type::INT16:
      case schema::Type::UINT16:
      case schema::Type::ENUM:
        structNode.setDataWordCount(1);
        structNode.setPointerCount(0);
        break;

      case schema::Type::INT32:
      case schema::Type::UINT32:
      case schema::Type::FLOAT32:
        structNode.setDataWordCount(1);
        structNode.setPointerCount(0);
        break;

      case schema::Type::INT64:
      case schema::Type::UINT64:
      case schema::Type::FLOAT64:
        structNode.setDataWordCount(1);
        structNode.setPointerCount(0);
        break;

      case schema::Type::TEXT:
      case schema::Type::DATA:
      case schema::Type::LIST:
      case schema::Type::STRUCT:
      case schema::Type::INTERFACE:
      case schema::Type::ANY_POINTER:
        structNode.setDataWordCount(0);
        structNode.setPointerCount(1);
        break;
    }

    KJ_IF_MAYBE(s, matchSize) {
      auto match = s->getStruct();
      structNode.setDataWordCount(match.getDataWordCount());
      structNode.setPointerCount(match.getPointerCount());
    }

    auto field = structNode.initFields(1)[0];
    field.setName("member0");
    field.setCodeOrder(0);
    auto slot = field.initSlot();
    slot.setType(type);

    KJ_IF_MAYBE(p, matchPosition) {
      if (p->getOrdinal().isExplicit()) {
        field.getOrdinal().setExplicit(p->getOrdinal().getExplicit());
      } else {
        field.getOrdinal().setImplicit();
      }
      auto matchSlot = p->getSlot();
      slot.setOffset(matchSlot.getOffset());
      slot.setDefaultValue(matchSlot.getDefaultValue());
    } else {
      field.getOrdinal().setExplicit(0);
      slot.setOffset(0);

      schema::Value::Builder value = slot.initDefaultValue();
      switch (type.which()) {
        case schema::Type::VOID: value.setVoid(); break;
        case schema::Type::BOOL: value.setBool(false); break;
        case schema::Type::INT8: value.setInt8(0); break;
        case schema::Type::INT16: value.setInt16(0); break;
        case schema::Type::INT32: value.setInt32(0); break;
        case schema::Type::INT64: value.setInt64(0); break;
        case schema::Type::UINT8: value.setUint8(0); break;
        case schema::Type::UINT16: value.setUint16(0); break;
        case schema::Type::UINT32: value.setUint32(0); break;
        case schema::Type::UINT64: value.setUint64(0); break;
        case schema::Type::FLOAT32: value.setFloat32(0); break;
        case schema::Type::FLOAT64: value.setFloat64(0); break;
        case schema::Type::ENUM: value.setEnum(0); break;
        case schema::Type::TEXT: value.adoptText(Orphan<Text>()); break;
        case schema::Type::DATA: value.adoptData(Orphan<Data>()); break;
        case schema::Type::LIST: value.initList(); break;
        case schema::Type::STRUCT: value.initStruct(); break;
        case schema::Type::INTERFACE: value.setInterface(); break;
        case schema::Type::ANY_POINTER: value.initAnyPointer(); break;
      }
    }